

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnp.cpp
# Opt level: O1

int rs2LinProjection(Vector3d *X,Vector2d *u,Vector3d *v,Vector3d *C,Vector3d *w,Vector3d *t,
                    double f,double rd,double r0,int direction)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  Vector3d *pVVar4;
  ActualDstType actualDst;
  ActualDstType actualDst_1;
  uint uVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Matrix3d K;
  assign_op<double,_double> local_231;
  Vector3d *local_230;
  Vector3d *local_228;
  Vector3d *local_220;
  double local_218;
  double local_210;
  double local_208;
  undefined8 uStack_200;
  Vector3d local_1f8;
  undefined1 local_1d8 [16];
  double local_1c8;
  undefined1 local_1b8 [8];
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  RhsNested local_198;
  double *local_190;
  RhsNested local_188;
  Vector3d *local_180;
  Vector3d *local_178;
  scalar_constant_op<double> local_158;
  Vector3d *local_150;
  Vector3d local_138;
  undefined1 local_118 [16];
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  Matrix<double,_3,_3,_0,_3,_3> local_c8;
  Matrix<double,_3,_3,_0,_3,_3> local_78;
  
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       1.0;
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2];
  local_230 = C;
  local_220 = t;
  local_218 = rd;
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       f;
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       f;
  X_(&local_138);
  pVVar4 = local_230;
  dStack_1b0 = dStack_1b0 + 0.0;
  local_118._8_4_ = SUB84(dStack_1b0,0);
  local_118._0_8_ = (double)local_1b8 + 1.0;
  local_118._12_4_ = (int)((ulong)dStack_1b0 >> 0x20);
  local_108 = local_1a8 + 0.0;
  dStack_100 = dStack_1a0 + 0.0;
  local_f8 = (double)local_198 + 1.0;
  dStack_f0 = (double)local_190 + 0.0;
  local_e8 = (double)local_188 + 0.0;
  dStack_e0 = (double)local_180 + 0.0;
  local_d8 = (double)local_178 + 1.0;
  local_190 = &dStack_1b0;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (double)(local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + 2);
  dVar7 = (X->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [2];
  dVar2 = (X->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [0];
  dVar3 = (X->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [1];
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       dVar3 * dStack_100 + dVar2 * ((double)local_1b8 + 1.0) + dVar7 * local_e8;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       dVar3 * local_f8 + dVar2 * dStack_1b0 + dVar7 * dStack_e0;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       dStack_f0 * dVar3 + local_d8 * dVar7 + local_108 * dVar2;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       (double)local_230;
  dStack_1b0 = (local_230->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0] +
               local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2];
  local_1a8 = (local_230->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1] +
              local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[3];
  dStack_1a0 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[4] +
               (local_230->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
  local_188 = (RhsNested)0x3;
  auVar9._0_8_ = local_1a8 *
                 local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[3] +
                 dStack_1b0 *
                 local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0] +
                 dStack_1a0 *
                 local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[6];
  auVar9._8_8_ = local_1a8 *
                 local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[4] +
                 dStack_1b0 *
                 local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1] +
                 dStack_1a0 *
                 local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7];
  auVar10._0_8_ =
       local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5] * local_1a8 +
       dStack_1a0 *
       local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] + local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[2] * dStack_1b0;
  auVar10._8_8_ = auVar10._0_8_;
  auVar10 = divpd(auVar9,auVar10);
  *(undefined1 (*) [16])
   (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array =
       auVar10;
  dVar7 = 1e+15;
  uVar5 = 0;
  local_228 = X;
  local_1b8 = (undefined1  [8])&local_c8;
  local_198 = &local_c8;
  do {
    if (dVar7 <= 1e-10) {
      return 0;
    }
    local_208 = (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
                array[0];
    uStack_200 = 0;
    local_210 = (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
                array[1];
    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
           [direction];
    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (w->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [0] * local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (w->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [1] * local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] *
           (w->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [2];
    X_(&local_1f8);
    local_158.m_other =
         (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
         [direction];
    local_1b8 = (undefined1  [8])&local_c8;
    local_188 = (RhsNested)local_118;
    local_180 = local_228;
    local_178 = pVVar4;
    local_150 = local_220;
    local_198 = &local_78;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>,1>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)local_1d8,
               (Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_1>
                *)local_1b8,&local_231);
    auVar1._8_4_ = SUB84(local_1c8,0);
    auVar1._0_8_ = local_1c8;
    auVar1._12_4_ = (int)((ulong)local_1c8 >> 0x20);
    auVar10 = divpd(local_1d8,auVar1);
    dVar2 = (local_208 * local_208 + local_210 * local_210) * local_218 + 1.0;
    dVar3 = dVar2 * auVar10._0_8_;
    dVar2 = dVar2 * auVar10._8_8_;
    dVar7 = (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
            [0] - dVar3;
    dVar8 = (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
            [1] - dVar2;
    dVar7 = SQRT(dVar8 * dVar8 + dVar7 * dVar7);
    (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array[0] =
         dVar3;
    (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array[1] =
         dVar2;
    bVar6 = uVar5 < 0x65;
    uVar5 = uVar5 + (uVar5 < 0x65);
  } while (bVar6);
  return 2;
}

Assistant:

int rs2LinProjection(const Eigen::Vector3d &X, Eigen::Vector2d &u, const Eigen::Vector3d &v, const Eigen::Vector3d &C, const Eigen::Vector3d &w, const Eigen::Vector3d &t, double f, double rd, double r0, int direction){
    // First initiate u with a global shutter projection
    Eigen::Matrix<double,3,4> P;
    Eigen::Vector3d uh;
    Eigen::Matrix3d K = Eigen::Matrix3d::Zero();
    K.diagonal() << f, f, 1;
    Eigen::Matrix3d Rv = Eigen::Matrix3d::Identity() + X_(v); 
    uh = K* ( Rv * X + C );
    u = uh.head(2)/uh(2);


    double diff = 1e15;

    int niter = 0;

    Eigen::Vector3d temp;

    while(diff > 1e-10 ){
        double rc2 = u(0)*u(0) + u(1)*u(1);
        temp = K * ((Eigen::Matrix3d::Identity() + X_(u(direction) * w)) * Rv * X + C + u(direction) * t);
        temp = temp/temp(2);
        temp.head(2) *= (1 + rd * rc2);
        diff = (u - temp.head(2)).norm();
        u = temp.head(2);
        if(niter > 100){
            return WARN_NO_CONVERGENCE;
        }
        niter++;
    }

    return 0;
    
}